

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCount.h
# Opt level: O0

int If_LogCreateAndXorMulti(Vec_Int_t *vAig,int *pFaninLits,int nFanins,int nSuppAll,int fXor)

{
  int iVar1;
  int local_28;
  int i;
  int fXor_local;
  int nSuppAll_local;
  int nFanins_local;
  int *pFaninLits_local;
  Vec_Int_t *vAig_local;
  
  if (0 < nFanins) {
    for (local_28 = nFanins + -1; 0 < local_28; local_28 = local_28 + -1) {
      iVar1 = If_LogCreateAndXor(vAig,pFaninLits[local_28],pFaninLits[local_28 + -1],nSuppAll,fXor);
      pFaninLits[local_28 + -1] = iVar1;
    }
    return *pFaninLits;
  }
  __assert_fail("nFanins > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCount.h"
                ,0x53,"int If_LogCreateAndXorMulti(Vec_Int_t *, int *, int, int, int)");
}

Assistant:

static inline int If_LogCreateAndXorMulti( Vec_Int_t * vAig, int * pFaninLits, int nFanins, int nSuppAll, int fXor )
{
    int i;
    assert( nFanins > 0 );
    for ( i = nFanins - 1; i > 0; i-- )
        pFaninLits[i-1] = If_LogCreateAndXor( vAig, pFaninLits[i], pFaninLits[i-1], nSuppAll, fXor );
    return pFaninLits[0];
}